

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void writeTxa<TxaHeaderSwitch>(ostream *stream,TxaHeader *header,istream *reference)

{
  pointer pTVar1;
  pointer pTVar2;
  string s;
  TxaHeaderSwitch t;
  short local_84;
  uint16_t local_82;
  uint16_t local_80;
  uint16_t local_7e;
  undefined8 local_7c;
  uint32_t local_74;
  string local_70;
  undefined1 local_50 [8];
  undefined8 local_48;
  undefined8 local_3c;
  
  std::istream::seekg((long)reference,_S_beg);
  std::istream::read((char *)reference,(long)local_50);
  local_48._0_4_ = header->filesize;
  local_48._4_4_ = header->indexed;
  local_3c._0_4_ = header->largestDecodedChunk;
  local_3c._4_4_ = header->indexSize;
  std::ostream::write((char *)stream,(long)local_50);
  pTVar2 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    do {
      local_82 = pTVar2->index;
      local_80 = pTVar2->width;
      local_7e = pTVar2->height;
      local_7c._0_4_ = pTVar2->offset;
      local_7c._4_4_ = pTVar2->length;
      local_74 = pTVar2->decodedLength;
      iconv_convert_abi_cxx11_
                (&local_70,(pTVar2->name)._M_dataplus._M_p,(pTVar2->name)._M_string_length,
                 iconv_fromutf);
      std::__cxx11::string::resize
                ((ulong)&local_70,((byte)(undefined4)local_70._M_string_length & 0xfc) + 4);
      local_84 = (short)(undefined4)local_70._M_string_length + 0x14;
      std::ostream::write((char *)stream,(long)&local_84);
      std::ostream::write((char *)stream,(long)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar1);
  }
  return;
}

Assistant:

void writeTxa(std::ostream& stream, const TxaHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.size = header.filesize;
	h.setIndexSize(header.indexSize);
	h.indexed = header.indexed;
	h.largestDecodedChunk = header.largestDecodedChunk;

	writeRaw(stream, h);
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c;
		c.index = chunk.index;
		c.width = chunk.width;
		c.height = chunk.height;
		c.entryOffset = chunk.offset;
		c.entryLength = chunk.length;
		c.setDecLength(chunk.decodedLength);
		std::string s = fromUTF8(chunk.name);
		s.resize(align(s.size() + 1, 4));
		c.headerLength = sizeof(c) + s.size();
		writeRaw(stream, c);
		stream.write(s.data(), s.size());
	}
}